

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::SetWritable
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  ScriptContext *pSVar1;
  Type *oldType;
  JavascriptLibrary *pJVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  PropertyId propertyId_00;
  DynamicTypeHandler *pDVar6;
  ushort index;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_48;
  uint32 local_3c;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *pPStack_38;
  uint32 indexVal;
  
  if (0 < this->propertyCount) {
    index = 0;
    do {
      if ((this->descriptors[index].Id.ptr)->pid == propertyId) {
        oldType = (instance->super_RecyclableObject).type.ptr;
        if (value != 0) {
          BVar4 = SetAttribute(this,instance,index,'\x04');
          if (BVar4 == 0) {
            return 1;
          }
          DynamicObject::ChangeTypeIf(instance,oldType);
          return 1;
        }
        BVar4 = ClearAttribute(this,instance,index,'\x04');
        if (BVar4 == 0) {
          return 1;
        }
        DynamicObject::ChangeTypeIf(instance,oldType);
        pDVar6 = DynamicTypeHandler::GetCurrentTypeHandler(instance);
        pJVar2 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
        pPStack_38 = &pJVar2->typesWithOnlyWritablePropertyProtoChain;
        Memory::Recycler::WBSetBit((char *)&local_48);
        local_48 = pPStack_38;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
        this_00 = local_48;
        pSVar1 = (pJVar2->super_JavascriptLibraryBase).scriptContext.ptr;
        DynamicTypeHandler::SetHasOnlyWritableDataProperties(pDVar6,false);
        if ((pDVar6->flags & 0x20) == 0) {
          return 1;
        }
        propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(pSVar1,propertyId);
        ScriptContext::InvalidateStoreFieldCaches(pSVar1,propertyId_00);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
        return 1;
      }
      index = index + 1;
    } while ((uint)index < (uint)this->propertyCount);
  }
  pPStack_38 = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)CONCAT44(indexVal,value);
  pSVar1 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  bVar3 = DynamicObject::HasObjectArray(instance);
  iVar5 = 1;
  if ((bVar3) &&
     (BVar4 = ScriptContext::IsNumericPropertyId(pSVar1,propertyId,&local_3c), BVar4 != 0)) {
    pDVar6 = ConvertToTypeWithItemAttributes(this,instance);
    iVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x2a])
                      (pDVar6,instance,(ulong)(uint)propertyId,(ulong)pPStack_38 & 0xffffffff);
  }
  return iVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            ScriptContext* scriptContext = instance->GetScriptContext();
            uint32 indexVal;
            if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(instance)
                    ->SetWritable(instance, propertyId, value);
            }
            return true;
        }

        const Type* oldType = instance->GetType();
        if (value)
        {
            if (SetAttribute(instance, index, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches
            }
        }
        else
        {
            if (ClearAttribute(instance, index, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches

                // Clearing the attribute may have changed the type handler, so make sure
                // we access the current one.
                DynamicTypeHandler* const typeHandler = GetCurrentTypeHandler(instance);
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, PropertyNone, propertyId, library->GetScriptContext());
            }
        }
        return true;
    }